

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test::
TestBody(ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test *this)

{
  EncoderTest *pEVar1;
  pointer pFVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  SEARCH_METHODS *pSVar7;
  uint uVar8;
  uint *val1;
  pointer pFVar9;
  AssertHelper local_d0;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int resize_down_count;
  uint last_h;
  uint last_w;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,300);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  (this->super_ResizeRealtimeTest).super_EncoderTest.init_flags_ = 0x10000;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w = 0x160;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h = 0x120;
  (this->super_ResizeRealtimeTest).change_bitrate_ = true;
  (this->super_ResizeRealtimeTest).frame_change_bitrate_ = 0x78;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  (this->super_ResizeRealtimeTest).is_screen_ = true;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_resize_mode = 3;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_target_bitrate = 100;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x500;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x500;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      uVar5 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w;
      uVar4 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h;
      resize_down_count = 0;
      pFVar9 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      last_h = uVar4;
      last_w = uVar5;
      if (pFVar9 != pFVar2) {
        uVar8 = 0;
        val1 = &pFVar9->h;
        do {
          if ((val1[-1] != uVar5) || (*val1 != uVar4)) {
            uVar5 = val1[-1];
            if (uVar8 < (this->super_ResizeRealtimeTest).frame_change_bitrate_) {
              testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                        ((internal *)&gtest_fatal_failure_checker,"info.w","last_w",val1 + -1,
                         &last_w);
              if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface == '\0') {
                testing::Message::Message((Message *)&local_d0);
                if ((undefined8 *)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_) ==
                    (undefined8 *)0x0) {
                  pSVar7 = "";
                }
                else {
                  pSVar7 = *(SEARCH_METHODS **)
                            CONCAT71(gtest_fatal_failure_checker._9_7_,
                                     gtest_fatal_failure_checker.has_new_fatal_failure_);
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                           ,0x3f4,(char *)pSVar7);
                testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
                }
                puVar6 = (undefined8 *)
                         CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
                if (puVar6 == (undefined8 *)0x0) goto LAB_00671359;
                if ((undefined8 *)*puVar6 != puVar6 + 2) {
                  operator_delete((undefined8 *)*puVar6);
                }
                goto LAB_00671351;
              }
              puVar6 = (undefined8 *)
                       CONCAT71(gtest_fatal_failure_checker._9_7_,
                                gtest_fatal_failure_checker.has_new_fatal_failure_);
              if (puVar6 != (undefined8 *)0x0) {
                if ((undefined8 *)*puVar6 != puVar6 + 2) {
                  operator_delete((undefined8 *)*puVar6);
                }
                operator_delete(puVar6);
              }
              testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                        ((internal *)&gtest_fatal_failure_checker,"info.h","last_h",val1,&last_h);
              if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface == '\0') {
                testing::Message::Message((Message *)&local_d0);
                if ((undefined8 *)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_) ==
                    (undefined8 *)0x0) {
                  pSVar7 = "";
                }
                else {
                  pSVar7 = *(SEARCH_METHODS **)
                            CONCAT71(gtest_fatal_failure_checker._9_7_,
                                     gtest_fatal_failure_checker.has_new_fatal_failure_);
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                           ,0x3f5,(char *)pSVar7);
                testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
                }
                puVar6 = (undefined8 *)
                         CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
                if (puVar6 == (undefined8 *)0x0) goto LAB_00671359;
                if ((undefined8 *)*puVar6 != puVar6 + 2) {
                  operator_delete((undefined8 *)*puVar6);
                }
                goto LAB_00671351;
              }
              puVar6 = (undefined8 *)
                       CONCAT71(gtest_fatal_failure_checker._9_7_,
                                gtest_fatal_failure_checker.has_new_fatal_failure_);
              if (puVar6 != (undefined8 *)0x0) {
                if ((undefined8 *)*puVar6 != puVar6 + 2) {
                  operator_delete((undefined8 *)*puVar6);
                }
                operator_delete(puVar6);
              }
              resize_down_count = resize_down_count + 1;
              uVar5 = val1[-1];
            }
            uVar4 = *val1;
            last_h = uVar4;
            last_w = uVar5;
          }
          uVar8 = uVar8 + 1;
          pFVar9 = (pointer)(val1 + 1);
          val1 = val1 + 4;
        } while (pFVar9 != pFVar2);
      }
      local_d0.data_._0_4_ = 1;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)&gtest_fatal_failure_checker,"resize_down_count","1",&resize_down_count
                 ,(int *)&local_d0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                   "Resizing down should occur at lease once.",0x29);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar7 = "";
        }
        else {
          pSVar7 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x3ff,(char *)pSVar7);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
        }
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 == (undefined8 *)0x0) goto LAB_00671359;
        if ((undefined8 *)*puVar6 != puVar6 + 2) {
          operator_delete((undefined8 *)*puVar6);
        }
      }
      else {
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar6 != puVar6 + 2) {
            operator_delete((undefined8 *)*puVar6);
          }
          operator_delete(puVar6);
        }
        local_d0.data_._0_4_ = 0;
        local_c8.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                   "GetMismatchFrames()",(uint *)&local_d0,(uint *)&local_c8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar7 = "";
          }
          else {
            pSVar7 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x401,(char *)pSVar7);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
          }
        }
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 == (undefined8 *)0x0) goto LAB_00671359;
        if ((undefined8 *)*puVar6 != puVar6 + 2) {
          operator_delete((undefined8 *)*puVar6);
        }
      }
LAB_00671351:
      operator_delete(puVar6);
      goto LAB_00671359;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x3e9,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00671359:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDownUpChangeBitRateScreen) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 300);
  init_flags_ = AOM_CODEC_USE_PSNR;
  cfg_.g_w = 352;
  cfg_.g_h = 288;
  change_bitrate_ = true;
  frame_change_bitrate_ = 120;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  is_screen_ = true;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 100;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  unsigned int frame_number = 0;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      if (frame_number < frame_change_bitrate_) {
        // Verify that resize down occurs, before bitrate is increased.
        ASSERT_LT(info.w, last_w);
        ASSERT_LT(info.h, last_h);
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
    frame_number++;
  }

  // Verify that we get at least 1 resize event in this test.
  ASSERT_GE(resize_down_count, 1)
      << "Resizing down should occur at lease once.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}